

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::DerivedRatioToStandard::
DerivedRatioToStandard<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (DerivedRatioToStandard *this,int LTY,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  this->lty_ = LTY;
  ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->list_,it,end,lineNumber,MAT,MF,MT);
  verifyLTY(this->lty_);
  return;
}

Assistant:

DerivedRatioToStandard( int LTY,
                  Iterator& it, const Iterator& end, long& lineNumber,
                  int MAT, int MF, int MT ) :
  lty_( LTY ),
  list_( ListRecord( it, end, lineNumber, MAT, MF, MT ) ) {

    verifyLTY( this->LTY() );
  }